

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_vfs_or_default_seek
                    (ma_vfs *pVFS,ma_vfs_file file,ma_int64 offset,ma_seek_origin origin)

{
  ma_result mVar1;
  int iVar2;
  
  if (pVFS == (ma_vfs *)0x0) {
    if (file != (ma_vfs_file)0x0) {
      iVar2 = (origin == ma_seek_origin_end) + 1;
      if (origin == ma_seek_origin_start) {
        iVar2 = 0;
      }
      iVar2 = fseek((FILE *)file,offset,iVar2);
      return -(uint)(iVar2 != 0);
    }
  }
  else if (file != (ma_vfs_file)0x0) {
    if (*(code **)((long)pVFS + 0x28) != (code *)0x0) {
      mVar1 = (**(code **)((long)pVFS + 0x28))();
      return mVar1;
    }
    return MA_NOT_IMPLEMENTED;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_vfs_or_default_seek(ma_vfs* pVFS, ma_vfs_file file, ma_int64 offset, ma_seek_origin origin)
{
    if (pVFS != NULL) {
        return ma_vfs_seek(pVFS, file, offset, origin);
    } else {
        return ma_default_vfs_seek(pVFS, file, offset, origin);
    }
}